

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ResolveSelfReference(Parse *pParse,Table *pTab,int type,Expr *pExpr,ExprList *pList)

{
  Expr *in_RCX;
  uint in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  int rc;
  NameContext sNC;
  SrcList sSrc;
  int local_c4;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 local_90 [8];
  undefined4 *local_88;
  uint local_68;
  undefined4 local_58 [2];
  undefined8 local_50;
  undefined4 local_34;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_58,0xaa,0x50);
  memset(local_90,0xaa,0x38);
  memset(local_90,0,0x38);
  memset(local_58,0,0x50);
  if (in_RSI != (undefined8 *)0x0) {
    local_58[0] = 1;
    local_50 = *in_RSI;
    local_34 = 0xffffffff;
    if (in_RSI[0xc] != *(long *)(*(long *)(*in_RDI + 0x20) + 0x38)) {
      in_EDX = in_EDX | 0x40000;
    }
  }
  local_88 = local_58;
  local_68 = in_EDX | 0x10000;
  local_c4 = sqlite3ResolveExprNames
                       ((NameContext *)CONCAT44(in_EDX,in_stack_ffffffffffffff50),in_RCX);
  if ((local_c4 == 0) && (in_R8 != 0)) {
    local_c4 = sqlite3ResolveExprListNames
                         ((NameContext *)CONCAT44(in_EDX,in_stack_ffffffffffffff50),
                          (ExprList *)in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveSelfReference(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* The table being referenced, or NULL */
  int type,        /* NC_IsCheck, NC_PartIdx, NC_IdxExpr, NC_GenCol, or 0 */
  Expr *pExpr,     /* Expression to resolve.  May be NULL. */
  ExprList *pList  /* Expression list to resolve.  May be NULL. */
){
  SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
  NameContext sNC;                /* Name context for pParse->pNewTable */
  int rc;

  assert( type==0 || pTab!=0 );
  assert( type==NC_IsCheck || type==NC_PartIdx || type==NC_IdxExpr
          || type==NC_GenCol || pTab==0 );
  memset(&sNC, 0, sizeof(sNC));
  memset(&sSrc, 0, sizeof(sSrc));
  if( pTab ){
    sSrc.nSrc = 1;
    sSrc.a[0].zName = pTab->zName;
    sSrc.a[0].pSTab = pTab;
    sSrc.a[0].iCursor = -1;
    if( pTab->pSchema!=pParse->db->aDb[1].pSchema ){
      /* Cause EP_FromDDL to be set on TK_FUNCTION nodes of non-TEMP
      ** schema elements */
      type |= NC_FromDDL;
    }
  }
  sNC.pParse = pParse;
  sNC.pSrcList = &sSrc;
  sNC.ncFlags = type | NC_IsDDL;
  if( (rc = sqlite3ResolveExprNames(&sNC, pExpr))!=SQLITE_OK ) return rc;
  if( pList ) rc = sqlite3ResolveExprListNames(&sNC, pList);
  return rc;
}